

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Allocations.cpp
# Opt level: O0

void Allocations::collectPoolStats(AllocationStats *stats)

{
  bool bVar1;
  reference ppVar2;
  pair<const_Allocations::Key,_long> it;
  iterator __end1;
  iterator __begin1;
  map<Allocations::Key,_long,_std::less<Allocations::Key>,_std::allocator<std::pair<const_Allocations::Key,_long>_>_>
  *__range1;
  AllocationStats *stats_local;
  
  __end1 = std::
           map<Allocations::Key,_long,_std::less<Allocations::Key>,_std::allocator<std::pair<const_Allocations::Key,_long>_>_>
           ::begin(&pools);
  it.second = (long)std::
                    map<Allocations::Key,_long,_std::less<Allocations::Key>,_std::allocator<std::pair<const_Allocations::Key,_long>_>_>
                    ::end(&pools);
  while( true ) {
    bVar1 = std::operator!=(&__end1,(_Self *)&it.second);
    if (!bVar1) break;
    ppVar2 = std::_Rb_tree_iterator<std::pair<const_Allocations::Key,_long>_>::operator*(&__end1);
    it.first.fileID = (ppVar2->first).position;
    it.first.position = ppVar2->second;
    if (stats->largestPoolSize < it.first.position) {
      stats->largestPoolPosition = it.first.fileID;
      stats->largestPoolSize = it.first.position;
    }
    stats->totalPoolSize = it.first.position + stats->totalPoolSize;
    std::_Rb_tree_iterator<std::pair<const_Allocations::Key,_long>_>::operator++(&__end1);
  }
  return;
}

Assistant:

void Allocations::collectPoolStats(AllocationStats &stats)
{
	for (auto it : pools)
	{
		if (it.second > stats.largestPoolSize)
		{
			stats.largestPoolPosition = it.first.position;
			stats.largestPoolSize = it.second;
		}

		stats.totalPoolSize += it.second;
	}
}